

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitors.c
# Opt level: O2

int main(int argc,char **argv)

{
  int height;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  GLFWvidmode *pGVar5;
  GLFWvidmode *pGVar6;
  char *pcVar7;
  GLFWmonitor *pGVar8;
  GLFWmonitor *pGVar9;
  GLFWwindow *handle;
  bool bVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  double dVar14;
  int count_1;
  int count_2;
  int local_84;
  uint local_80;
  uint local_7c;
  uint local_78 [2];
  int count;
  uint local_6c;
  int widthMM;
  int y;
  GLFWvidmode *local_60;
  GLFWmonitor **local_58;
  long local_50;
  GLFWmonitor *local_48;
  GLFWvidmode *local_40;
  ulong local_38;
  
  bVar2 = true;
  do {
    bVar10 = bVar2;
    iVar3 = getopt(argc,argv,"th");
    bVar2 = false;
  } while (iVar3 == 0x74);
  if (iVar3 == -1) {
    glfwSetErrorCallback(error_callback);
    iVar3 = glfwInit();
    if (iVar3 == 0) goto LAB_00105038;
    local_58 = glfwGetMonitors(&count);
    lVar11 = 0;
    while (lVar11 < count) {
      pGVar9 = local_58[lVar11];
      local_50 = lVar11;
      if (bVar10) {
        pGVar5 = glfwGetVideoMode(pGVar9);
        pGVar6 = glfwGetVideoModes(pGVar9,&count_2);
        glfwGetMonitorPos(pGVar9,&count_1,&y);
        glfwGetMonitorPhysicalSize(pGVar9,&widthMM,(int *)&local_6c);
        pcVar7 = glfwGetMonitorName(pGVar9);
        pGVar8 = glfwGetPrimaryMonitor();
        pcVar12 = "secondary";
        if (pGVar8 == pGVar9) {
          pcVar12 = "primary";
        }
        printf("Name: %s (%s)\n",pcVar7,pcVar12);
        format_mode(pGVar5);
        printf("Current mode: %s\n",format_mode::buffer);
        printf("Virtual position: %i %i\n",(ulong)(uint)count_1,(ulong)(uint)y);
        printf("Physical size: %i x %i mm (%0.2f dpi)\n",
               (double)(((float)pGVar5->width * 25.4) / (float)widthMM),(ulong)(uint)widthMM,
               (ulong)local_6c);
        puts("Modes:");
        for (uVar13 = 0; (long)uVar13 < (long)count_2; uVar13 = uVar13 + 1) {
          format_mode(pGVar6);
          printf("%3u: %s",uVar13 & 0xffffffff,format_mode::buffer);
          iVar3 = bcmp(pGVar5,pGVar6,0x18);
          if (iVar3 == 0) {
            printf(" (current mode)");
          }
          putchar(10);
          pGVar6 = pGVar6 + 1;
        }
      }
      else {
        local_40 = glfwGetVideoModes(pGVar9,&count_1);
        uVar13 = 0;
        local_48 = pGVar9;
        while (pGVar5 = local_40, pGVar9 = local_48, (long)uVar13 < (long)count_1) {
          pGVar6 = local_40 + uVar13;
          local_38 = uVar13;
          glfwWindowHint(0x21001,local_40[uVar13].redBits);
          glfwWindowHint(0x21002,pGVar5[uVar13].greenBits);
          glfwWindowHint(0x21003,pGVar5[uVar13].blueBits);
          glfwWindowHint(0x2100f,pGVar5[uVar13].refreshRate);
          pcVar7 = glfwGetMonitorName(pGVar9);
          uVar1 = local_38;
          local_60 = pGVar6;
          format_mode(pGVar6);
          printf("Testing mode %u on monitor %s: %s\n",uVar1 & 0xffffffff,pcVar7,format_mode::buffer
                );
          iVar3 = pGVar5[uVar13].width;
          height = pGVar5[uVar13].height;
          pGVar9 = glfwGetPrimaryMonitor();
          handle = glfwCreateWindow(iVar3,height,"Video Mode Test",pGVar9,(GLFWwindow *)0x0);
          if (handle == (GLFWwindow *)0x0) {
            format_mode(local_60);
            printf("Failed to enter mode %u: %s\n",uVar1 & 0xffffffff,format_mode::buffer);
          }
          else {
            glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
            glfwSetKeyCallback(handle,key_callback);
            glfwMakeContextCurrent(handle);
            glfwSwapInterval(1);
            glfwSetTime(0.0);
            pGVar5 = local_60;
            while (dVar14 = glfwGetTime(), dVar14 < 5.0) {
              glClear(0x4000);
              glfwSwapBuffers(handle);
              glfwPollEvents();
              iVar3 = glfwWindowShouldClose(handle);
              if (iVar3 != 0) {
                puts("User terminated program");
                goto LAB_0010504c;
              }
            }
            glGetIntegerv(0xd52,&local_80);
            glGetIntegerv(0xd53,&local_7c);
            glGetIntegerv(0xd54,local_78);
            glfwGetWindowSize(handle,&count_2,&local_84);
            if (local_80 == pGVar5->redBits) {
              uVar13 = (ulong)(uint)pGVar5->greenBits;
              uVar4 = pGVar5->blueBits;
              if ((local_7c != pGVar5->greenBits) ||
                 (uVar13 = (ulong)local_7c, local_78[0] != uVar4)) goto LAB_00104fc3;
            }
            else {
              uVar13 = (ulong)(uint)pGVar5->greenBits;
              uVar4 = pGVar5->blueBits;
LAB_00104fc3:
              printf("*** Color bit mismatch: (%i %i %i) instead of (%i %i %i)\n",(ulong)local_80,
                     (ulong)local_7c,(ulong)local_78[0],(ulong)(uint)pGVar5->redBits,uVar13,uVar4);
            }
            if (local_84 != pGVar5->height || count_2 != pGVar5->width) {
              printf("*** Size mismatch: %ix%i instead of %ix%i\n");
            }
            puts("Closing window");
            glfwDestroyWindow(handle);
            glfwPollEvents();
          }
          uVar13 = uVar1 + 1;
        }
      }
      lVar11 = local_50 + 1;
    }
LAB_0010504c:
    glfwTerminate();
  }
  else {
    if (iVar3 != 0x68) {
      usage();
LAB_00105038:
      exit(1);
    }
    usage();
  }
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, i, count, mode = LIST_MODE;
    GLFWmonitor** monitors;

    while ((ch = getopt(argc, argv, "th")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 't':
                mode = TEST_MODE;
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    monitors = glfwGetMonitors(&count);

    for (i = 0;  i < count;  i++)
    {
        if (mode == LIST_MODE)
            list_modes(monitors[i]);
        else if (mode == TEST_MODE)
            test_modes(monitors[i]);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}